

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_fwd.hpp
# Opt level: O2

void __thiscall
toml::source_location::source_location(source_location *this,source_location *param_1)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  undefined7 uVar8;
  
  bVar7 = param_1->is_ok_;
  uVar8 = *(undefined7 *)&param_1->field_0x1;
  sVar1 = param_1->first_line_;
  sVar2 = param_1->first_column_;
  sVar3 = param_1->first_offset_;
  sVar4 = param_1->last_line_;
  sVar5 = param_1->last_column_;
  sVar6 = param_1->length_;
  this->last_offset_ = param_1->last_offset_;
  this->length_ = sVar6;
  this->last_line_ = sVar4;
  this->last_column_ = sVar5;
  this->first_column_ = sVar2;
  this->first_offset_ = sVar3;
  this->is_ok_ = bVar7;
  *(undefined7 *)&this->field_0x1 = uVar8;
  this->first_line_ = sVar1;
  std::__cxx11::string::string
            ((string *)&this->file_name_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &param_1->file_name_);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->line_str_,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&param_1->line_str_);
  return;
}

Assistant:

source_location(source_location const&) = default;